

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::Identity(ParsedScene *this,FileLoc loc)

{
  Transform *__dest;
  long in_RDI;
  int i;
  Transform *this_00;
  undefined1 local_8c [28];
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  TransformSet *in_stack_ffffffffffffff98;
  FileLoc *in_stack_ffffffffffffffa0;
  int local_c;
  
  this_00 = (Transform *)&stack0x00000008;
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[9]>
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (char (*) [9])CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  else {
    for (local_c = 0; local_c < 2; local_c = local_c + 1) {
      if ((*(uint *)(in_RDI + 0x964) & 1 << ((byte)local_c & 0x1f)) != 0) {
        memset(local_8c,0,0x80);
        pbrt::Transform::Transform(this_00);
        __dest = TransformSet::operator[](in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        memcpy(__dest,local_8c,0x80);
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::Identity(FileLoc loc) {
    VERIFY_INITIALIZED("Identity");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] = pbrt::Transform();)
}